

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_load_srsgpr(TCGContext_conflict6 *tcg_ctx,int from,int to)

{
  TCGTemp *a1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i32 ret;
  uintptr_t o_1;
  
  a1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  if (from == 0) {
    tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i64,(TCGArg)a1,0);
  }
  else {
    ts = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)ts - (long)tcg_ctx);
    ts_00 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
    tcg_gen_op3_mips64el
              (tcg_ctx,INDEX_op_ld_i32,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x694);
    tcg_gen_shri_i32_mips64el(tcg_ctx,ret,ret,6);
    tcg_gen_andi_i32_mips64el(tcg_ctx,ret,ret,0xf);
    tcg_gen_muli_i32_mips64el(tcg_ctx,ret,ret,0x100);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),ret);
    tcg_gen_op3_mips64el
              (tcg_ctx,INDEX_op_add_i64,(TCGArg)ts_00,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
               (TCGArg)ts_00);
    tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)ts_00,(ulong)(uint)from << 3);
    tcg_temp_free_internal_mips64el(tcg_ctx,ts_00);
    tcg_temp_free_internal_mips64el(tcg_ctx,ts);
  }
  if ((to != 0) && (tcg_ctx->cpu_gpr[to] != (TCGv_i64)((long)a1 - (long)tcg_ctx))) {
    tcg_gen_op2_mips64el
              (tcg_ctx,INDEX_op_mov_i64,
               (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[to]),(TCGArg)a1);
  }
  tcg_temp_free_internal_mips64el
            (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)a1 - (long)tcg_ctx) + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_load_srsgpr(TCGContext *tcg_ctx, int from, int to)
{
    TCGv t0 = tcg_temp_new(tcg_ctx);

    if (from == 0) {
        tcg_gen_movi_tl(tcg_ctx, t0, 0);
    } else {
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_ptr addr = tcg_temp_new_ptr(tcg_ctx);

        tcg_gen_ld_i32(tcg_ctx, t2, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_SRSCtl));
        tcg_gen_shri_i32(tcg_ctx, t2, t2, CP0SRSCtl_PSS);
        tcg_gen_andi_i32(tcg_ctx, t2, t2, 0xf);
        tcg_gen_muli_i32(tcg_ctx, t2, t2, sizeof(target_ulong) * 32);
        tcg_gen_ext_i32_ptr(tcg_ctx, addr, t2);
        tcg_gen_add_ptr(tcg_ctx, addr, tcg_ctx->cpu_env, addr);

        tcg_gen_ld_tl(tcg_ctx, t0, addr, sizeof(target_ulong) * from);
        tcg_temp_free_ptr(tcg_ctx, addr);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    gen_store_gpr(tcg_ctx, t0, to);
    tcg_temp_free(tcg_ctx, t0);
}